

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O3

void __thiscall
primecount::Vector<primecount::PhiTiny::sieve_t,_std::allocator<primecount::PhiTiny::sieve_t>_>::
resize(Vector<primecount::PhiTiny::sieve_t,_std::allocator<primecount::PhiTiny::sieve_t>_> *this,
      size_t n)

{
  sieve_t *psVar1;
  ulong uVar2;
  
  psVar1 = this->array_;
  uVar2 = ((long)this->end_ - (long)psVar1 >> 2) * -0x5555555555555555;
  if (uVar2 < n) {
    if ((ulong)(((long)this->capacity_ - (long)psVar1 >> 2) * -0x5555555555555555) < n) {
      reserve_unchecked(this,n);
      psVar1 = this->array_;
    }
  }
  else if (uVar2 < n || uVar2 - n == 0) {
    return;
  }
  this->end_ = psVar1 + n;
  return;
}

Assistant:

void resize(std::size_t n)
  {
    if (n > size())
    {
      if (n > capacity())
        reserve_unchecked(n);

      // This default initializes memory of classes and structs
      // with constructors (and with in-class initialization of
      // non-static members). But it does not default initialize
      // memory for POD types like int, long.
      if (!std::is_trivial<T>::value)
        uninitialized_default_construct(end_, array_ + n);

      end_ = array_ + n;
    }
    else if (n < size())
    {
      destroy(array_ + n, end_);
      end_ = array_ + n;
    }
  }